

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::SolveData::BoundArray::~BoundArray(BoundArray *this)

{
  LevelRef *pLVar1;
  pointer ppLVar2;
  size_type sVar3;
  
  sVar3 = (this->refs).ebo_.size;
  while (sVar3 != 0) {
    pLVar1 = (this->refs).ebo_.buf[sVar3 - 1];
    if (pLVar1 != (LevelRef *)0x0) {
      operator_delete(pLVar1);
    }
    sVar3 = (this->refs).ebo_.size - 1;
    (this->refs).ebo_.size = sVar3;
  }
  ppLVar2 = (this->refs).ebo_.buf;
  if (ppLVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppLVar2);
  return;
}

Assistant:

~BoundArray() { while (!refs.empty()) { delete refs.back(); refs.pop_back(); } }